

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlnRetime.c
# Opt level: O0

int Wln_RetRemoveOneFanin(Wln_Ret_t *p,int iObj)

{
  int iVar1;
  int iVar2;
  int *piVar3;
  int *piVar4;
  bool bVar5;
  int *pFanins;
  int iFlop1;
  int iFlop;
  int *pLink;
  int local_18;
  int iFanin;
  int k;
  int iObj_local;
  Wln_Ret_t *p_local;
  
  pFanins._0_4_ = -1;
  piVar3 = Wln_RetFanins(p,iObj);
  local_18 = 0;
  do {
    iVar1 = Wln_ObjFaninNum(p->pNtk,iObj);
    bVar5 = false;
    if (local_18 < iVar1) {
      piVar4 = Wln_RetFanins(p,iObj);
      pLink._4_4_ = piVar4[local_18 << 1];
      piVar4 = Wln_RetFanins(p,iObj);
      _iFlop1 = piVar4 + (long)(local_18 << 1) + 1;
      bVar5 = _iFlop1 != (int *)0x0;
    }
    if (!bVar5) {
      return (int)pFanins;
    }
    if (((pLink._4_4_ != 0) &&
        ((iVar1 = Wln_ObjFaninNum(p->pNtk,pLink._4_4_), iVar1 != 0 ||
         (iVar1 = Wln_ObjIsCi(p->pNtk,pLink._4_4_), iVar1 != 0)))) &&
       ((iVar1 = Wln_ObjIsFf(p->pNtk,iObj), iVar1 == 0 || (local_18 < 1)))) {
      if (*_iFlop1 == 0) {
        __assert_fail("pLink[0]",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/wln/wlnRetime.c"
                      ,0x1b0,"int Wln_RetRemoveOneFanin(Wln_Ret_t *, int)");
      }
      iVar1 = Vec_IntEntry(&p->vEdgeLinks,*_iFlop1 + 1);
      iVar2 = Vec_IntEntry(&p->vEdgeLinks,*_iFlop1);
      piVar3[local_18 * 2 + 1] = iVar2;
      iVar2 = Wln_ObjIsFf(p->pNtk,iVar1);
      if (iVar2 == 0) {
        __assert_fail("Wln_ObjIsFf( p->pNtk, iFlop )",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/wln/wlnRetime.c"
                      ,0x1b3,"int Wln_RetRemoveOneFanin(Wln_Ret_t *, int)");
      }
      if ((int)pFanins == -1) {
        pFanins._0_4_ = iVar1;
      }
    }
    local_18 = local_18 + 1;
  } while( true );
}

Assistant:

int Wln_RetRemoveOneFanin( Wln_Ret_t * p, int iObj )
{
    int k, iFanin, * pLink, iFlop, iFlop1 = -1;
    int * pFanins  = Wln_RetFanins( p, iObj );
    Wln_RetForEachFanin( p, iObj, iFanin, pLink, k )
    {
        if ( Wln_ObjIsFf(p->pNtk, iObj) && k > 0 )
            continue;
        assert( pLink[0] );
        iFlop = Vec_IntEntry( &p->vEdgeLinks, pLink[0] + 1 );
        pFanins[2*k+1] = Vec_IntEntry( &p->vEdgeLinks, pLink[0] );
        assert( Wln_ObjIsFf( p->pNtk, iFlop ) );
        if ( iFlop1 == -1 )
            iFlop1 = iFlop;
    }
    return iFlop1;
}